

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxList * __thiscall amrex::BoxArray::boxList(BoxList *__return_storage_ptr__,BoxArray *this)

{
  long *plVar1;
  BATType BVar2;
  element_type *peVar3;
  pointer pBVar4;
  long lVar5;
  long lVar6;
  IndexType IVar7;
  uint uVar8;
  uint uVar9;
  int dir_1;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  IntVect IVar17;
  Box result;
  Box bx;
  int local_5c [3];
  element_type *local_50;
  ulong local_48;
  int local_40 [3];
  
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar4 = *(pointer *)
            ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data + 8);
  lVar15 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data;
  BoxList::BoxList(__return_storage_ptr__);
  uVar9 = (uint)(((long)pBVar4 - lVar15) / 0x1c);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::reserve
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)__return_storage_ptr__,
             (long)(int)uVar9);
  if (0 < (int)uVar9) {
    IVar7 = BATransformer::index_type(&this->m_bat);
    (__return_storage_ptr__->btype).itype = IVar7.itype;
    peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    BVar2 = (this->m_bat).m_bat_type;
    if (BVar2 == bndryReg) {
      for (lVar15 = 0; (ulong)(uVar9 & 0x7fffffff) * 0x1c - lVar15 != 0; lVar15 = lVar15 + 0x1c) {
        BATbndryReg::operator()
                  (&bx,&(this->m_bat).m_op.m_bndryReg,
                   (Box *)(*(long *)&(peVar3->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar15));
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)__return_storage_ptr__,&bx);
      }
    }
    else if (BVar2 == null) {
      for (lVar15 = 0; (ulong)(uVar9 & 0x7fffffff) * 0x1c - lVar15 != 0; lVar15 = lVar15 + 0x1c) {
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)__return_storage_ptr__,
                   (value_type *)
                   (*(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data + lVar15));
      }
    }
    else {
      local_50 = peVar3;
      IVar7 = BATransformer::index_type(&this->m_bat);
      IVar17 = BATransformer::coarsen_ratio(&this->m_bat);
      iVar11 = IVar17.vect[2];
      local_40[0] = IVar17.vect[0];
      local_40[1] = IVar17.vect[1];
      local_40[2] = IVar17.vect[2];
      iVar14 = IVar17.vect[0];
      local_48 = (ulong)(uVar9 & 0x7fffffff);
      for (uVar13 = 0; uVar13 != local_48; uVar13 = uVar13 + 1) {
        lVar15 = *(long *)&(local_50->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data;
        plVar1 = (long *)(lVar15 + uVar13 * 0x1c);
        lVar12 = *plVar1;
        lVar5 = plVar1[1];
        plVar1 = (long *)(lVar15 + 0xc + uVar13 * 0x1c);
        lVar15 = *plVar1;
        lVar6 = plVar1[1];
        result.bigend.vect[1] = (int)((ulong)lVar15 >> 0x20);
        result.bigend.vect[2] = (int)lVar6;
        result.btype.itype = (int)((ulong)lVar6 >> 0x20);
        result.smallend.vect[2] = (int)lVar5;
        result.bigend.vect[0] = (int)((ulong)lVar5 >> 0x20);
        iVar16 = IVar17.vect[1];
        result.smallend.vect[1] = (int)((ulong)lVar12 >> 0x20);
        uVar9 = result.smallend.vect[1];
        if (IVar17.vect._0_8_ >> 0x20 == 1 && iVar14 == 1) {
          result.smallend.vect._0_8_ = lVar12;
          if (iVar11 != 1) goto LAB_0041dd62;
        }
        else {
          result.smallend.vect[0] = (int)lVar12;
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              if (result.smallend.vect[0] < 0) {
                result.smallend.vect[0] = result.smallend.vect[0] >> 2;
              }
              else {
                result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
              }
            }
            else if (iVar14 == 2) {
              if (result.smallend.vect[0] < 0) {
                result.smallend.vect[0] = result.smallend.vect[0] >> 1;
              }
              else {
                result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
              }
            }
            else if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar14);
            }
            else {
              result.smallend.vect[0] = result.smallend.vect[0] / iVar14;
            }
          }
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              if (lVar12 < 0) {
                uVar9 = result.smallend.vect[1] >> 2;
              }
              else {
                uVar9 = (uint)result.smallend.vect[1] >> 2;
              }
            }
            else if (iVar16 == 2) {
              if (lVar12 < 0) {
                uVar9 = result.smallend.vect[1] >> 1;
              }
              else {
                uVar9 = (uint)result.smallend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar9 = ~(~result.smallend.vect[1] / iVar16);
            }
            else {
              uVar9 = result.smallend.vect[1] / iVar16;
            }
          }
LAB_0041dd62:
          result.smallend.vect[1] = uVar9;
          if (iVar11 != 1) {
            if (iVar11 == 4) {
              if (result.smallend.vect[2] < 0) {
                result.smallend.vect[2] = result.smallend.vect[2] >> 2;
              }
              else {
                result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
              }
            }
            else if (iVar11 == 2) {
              if (result.smallend.vect[2] < 0) {
                result.smallend.vect[2] = result.smallend.vect[2] >> 1;
              }
              else {
                result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
              }
            }
            else if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = ~(~result.smallend.vect[2] / iVar11);
            }
            else {
              result.smallend.vect[2] = result.smallend.vect[2] / iVar11;
            }
          }
          result.btype.itype = (uint)((ulong)lVar6 >> 0x20);
          result.bigend.vect[2] = (int)lVar6;
          if (result.btype.itype == 0) {
            uVar9 = result.bigend.vect[0];
            if (iVar14 != 1) {
              if (iVar14 == 4) {
                uVar9 = result.bigend.vect[0] >> 2;
                if (-1 < lVar5) {
                  uVar9 = (uint)result.bigend.vect[0] >> 2;
                }
              }
              else if (iVar14 == 2) {
                uVar9 = result.bigend.vect[0] >> 1;
                if (-1 < lVar5) {
                  uVar9 = (uint)result.bigend.vect[0] >> 1;
                }
              }
              else if (lVar5 < 0) {
                uVar9 = ~(~result.bigend.vect[0] / iVar14);
              }
              else {
                uVar9 = result.bigend.vect[0] / iVar14;
              }
            }
            result.bigend.vect[0] = uVar9;
            uVar9 = result.bigend.vect[1];
            if (iVar16 != 1) {
              if (iVar16 == 4) {
                uVar9 = result.bigend.vect[1] >> 2;
                if (-1 < lVar15) {
                  uVar9 = (uint)result.bigend.vect[1] >> 2;
                }
              }
              else if (iVar16 == 2) {
                uVar9 = result.bigend.vect[1] >> 1;
                if (-1 < lVar15) {
                  uVar9 = (uint)result.bigend.vect[1] >> 1;
                }
              }
              else if (lVar15 < 0) {
                uVar9 = ~(~result.bigend.vect[1] / iVar16);
              }
              else {
                uVar9 = result.bigend.vect[1] / iVar16;
              }
            }
            result.bigend.vect[1] = uVar9;
            uVar9 = result.bigend.vect[2];
            if (iVar11 != 1) {
              if (iVar11 == 4) {
                uVar9 = result.bigend.vect[2] >> 2;
                if (-1 < result.bigend.vect[2]) {
                  uVar9 = (uint)result.bigend.vect[2] >> 2;
                }
              }
              else if (iVar11 == 2) {
                uVar9 = result.bigend.vect[2] >> 1;
                if (-1 < result.bigend.vect[2]) {
                  uVar9 = (uint)result.bigend.vect[2] >> 1;
                }
              }
              else if (result.bigend.vect[2] < 0) {
                uVar9 = ~(~result.bigend.vect[2] / iVar11);
              }
              else {
                uVar9 = result.bigend.vect[2] / iVar11;
              }
            }
          }
          else {
            local_5c[0] = 0;
            local_5c[1] = 0;
            local_5c[2] = 0;
            for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
              if (((result.btype.itype >> ((uint)lVar12 & 0x1f) & 1) != 0) &&
                 (result.bigend.vect[lVar12] % local_40[lVar12] != 0)) {
                local_5c[lVar12] = 1;
              }
            }
            uVar9 = result.bigend.vect[0];
            if (iVar14 != 1) {
              if (iVar14 == 4) {
                uVar9 = result.bigend.vect[0] >> 2;
                if (-1 < lVar5) {
                  uVar9 = (uint)result.bigend.vect[0] >> 2;
                }
              }
              else if (iVar14 == 2) {
                uVar9 = result.bigend.vect[0] >> 1;
                if (-1 < lVar5) {
                  uVar9 = (uint)result.bigend.vect[0] >> 1;
                }
              }
              else if (lVar5 < 0) {
                uVar9 = ~(~result.bigend.vect[0] / iVar14);
              }
              else {
                uVar9 = result.bigend.vect[0] / iVar14;
              }
            }
            uVar10 = result.bigend.vect[1];
            if (iVar16 != 1) {
              if (iVar16 == 4) {
                uVar10 = result.bigend.vect[1] >> 2;
                if (-1 < lVar15) {
                  uVar10 = (uint)result.bigend.vect[1] >> 2;
                }
              }
              else if (iVar16 == 2) {
                uVar10 = result.bigend.vect[1] >> 1;
                if (-1 < lVar15) {
                  uVar10 = (uint)result.bigend.vect[1] >> 1;
                }
              }
              else if (lVar15 < 0) {
                uVar10 = ~(~result.bigend.vect[1] / iVar16);
              }
              else {
                uVar10 = result.bigend.vect[1] / iVar16;
              }
            }
            uVar8 = result.bigend.vect[2];
            if (iVar11 != 1) {
              if (iVar11 == 4) {
                uVar8 = result.bigend.vect[2] >> 2;
                if (-1 < result.bigend.vect[2]) {
                  uVar8 = (uint)result.bigend.vect[2] >> 2;
                }
              }
              else if (iVar11 == 2) {
                uVar8 = result.bigend.vect[2] >> 1;
                if (-1 < result.bigend.vect[2]) {
                  uVar8 = (uint)result.bigend.vect[2] >> 1;
                }
              }
              else if (result.bigend.vect[2] < 0) {
                uVar8 = ~(~result.bigend.vect[2] / iVar11);
              }
              else {
                uVar8 = result.bigend.vect[2] / iVar11;
              }
            }
            result.bigend.vect[0] = uVar9 + local_5c[0];
            result.bigend.vect[1] = uVar10 + local_5c[1];
            uVar9 = uVar8 + local_5c[2];
          }
          result.bigend.vect[2] = uVar9;
        }
        bx.bigend.vect[1] = result.bigend.vect[1];
        bx.bigend.vect[2] = result.bigend.vect[2];
        bx.btype = result.btype;
        bx.smallend.vect[0] = result.smallend.vect[0];
        bx.smallend.vect[1] = result.smallend.vect[1];
        bx.smallend.vect[2] = result.smallend.vect[2];
        bx.bigend.vect[0] = result.bigend.vect[0];
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          uVar9 = 1 << ((byte)lVar15 & 0x1f);
          uVar10 = (uint)lVar15;
          bx.bigend.vect[lVar15] =
               (bx.bigend.vect[lVar15] + (uint)((IVar7.itype >> (uVar10 & 0x1f) & 1) != 0)) -
               (uint)((bx.btype.itype >> (uVar10 & 0x1f) & 1) != 0);
          if ((IVar7.itype >> (uVar10 & 0x1f) & 1) == 0) {
            bx.btype.itype = ~uVar9 & bx.btype.itype;
          }
          else {
            bx.btype.itype = uVar9 | bx.btype.itype;
          }
        }
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)__return_storage_ptr__,&bx);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoxList
BoxArray::boxList () const
{
    const int N = size();
    BoxList newb;
    newb.data().reserve(N);
    if (N > 0) {
        newb.set(ixType());
        auto const& bxs = this->m_ref->m_abox;
        if (m_bat.is_null()) {
            for (int i = 0; i < N; ++i) {
                newb.push_back(bxs[i]);
            }
        } else if (m_bat.is_simple()) {
            IndexType t = ixType();
            IntVect cr = crseRatio();
            for (int i = 0; i < N; ++i) {
                newb.push_back(amrex::convert(amrex::coarsen(bxs[i],cr),t));
            }
        } else {
            for (int i = 0; i < N; ++i) {
                newb.push_back(m_bat.m_op.m_bndryReg(bxs[i]));
            }
        }
    }
    return newb;
}